

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxshift.hpp
# Opt level: O2

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::shiftPvec(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this)

{
  Random *this_00;
  pointer pnVar1;
  pointer pnVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  type_conflict5 tVar6;
  long lVar7;
  cpp_dec_float<200U,_int,_void> *pcVar8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar9;
  uint uVar10;
  cpp_dec_float<200U,_int,_void> *pcVar11;
  byte bVar12;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<200U,_int,_void> local_638;
  cpp_dec_float<200U,_int,_void> local_5b8;
  cpp_dec_float<200U,_int,_void> local_538;
  cpp_dec_float<200U,_int,_void> local_4b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxrandom;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  minrandom;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  allow;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar12 = 0;
  allow.m_backend.data._M_elems[0] = 0;
  allow.m_backend.data._M_elems[1] = 0x40240000;
  leavetol((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *)&maxrandom.m_backend,this);
  minrandom.m_backend.fpclass = cpp_dec_float_finite;
  minrandom.m_backend.prec_elem = 0x1c;
  minrandom.m_backend.data._M_elems[0] = 0;
  minrandom.m_backend.data._M_elems[1] = 0;
  minrandom.m_backend.data._M_elems[2] = 0;
  minrandom.m_backend.data._M_elems[3] = 0;
  minrandom.m_backend.data._M_elems[4] = 0;
  minrandom.m_backend.data._M_elems[5] = 0;
  minrandom.m_backend.data._M_elems[6] = 0;
  minrandom.m_backend.data._M_elems[7] = 0;
  minrandom.m_backend.data._M_elems[8] = 0;
  minrandom.m_backend.data._M_elems[9] = 0;
  minrandom.m_backend.data._M_elems[10] = 0;
  minrandom.m_backend.data._M_elems[0xb] = 0;
  minrandom.m_backend.data._M_elems[0xc] = 0;
  minrandom.m_backend.data._M_elems[0xd] = 0;
  minrandom.m_backend.data._M_elems[0xe] = 0;
  minrandom.m_backend.data._M_elems[0xf] = 0;
  minrandom.m_backend.data._M_elems[0x10] = 0;
  minrandom.m_backend.data._M_elems[0x11] = 0;
  minrandom.m_backend.data._M_elems[0x12] = 0;
  minrandom.m_backend.data._M_elems[0x13] = 0;
  minrandom.m_backend.data._M_elems[0x14] = 0;
  minrandom.m_backend.data._M_elems[0x15] = 0;
  minrandom.m_backend.data._M_elems[0x16] = 0;
  minrandom.m_backend.data._M_elems[0x17] = 0;
  minrandom.m_backend.data._M_elems[0x18] = 0;
  minrandom.m_backend.data._M_elems[0x19] = 0;
  minrandom.m_backend.data._M_elems._104_5_ = 0;
  minrandom.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  minrandom.m_backend.exp = 0;
  minrandom.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
            (&minrandom.m_backend,&maxrandom.m_backend,(double *)&allow.m_backend);
  result_1.m_backend.data._M_elems[0] = 0;
  result_1.m_backend.data._M_elems[1] = 0x40590000;
  leavetol((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *)&allow.m_backend,this);
  maxrandom.m_backend.fpclass = cpp_dec_float_finite;
  maxrandom.m_backend.prec_elem = 0x1c;
  maxrandom.m_backend.data._M_elems[0] = 0;
  maxrandom.m_backend.data._M_elems[1] = 0;
  maxrandom.m_backend.data._M_elems[2] = 0;
  maxrandom.m_backend.data._M_elems[3] = 0;
  maxrandom.m_backend.data._M_elems[4] = 0;
  maxrandom.m_backend.data._M_elems[5] = 0;
  maxrandom.m_backend.data._M_elems[6] = 0;
  maxrandom.m_backend.data._M_elems[7] = 0;
  maxrandom.m_backend.data._M_elems[8] = 0;
  maxrandom.m_backend.data._M_elems[9] = 0;
  maxrandom.m_backend.data._M_elems[10] = 0;
  maxrandom.m_backend.data._M_elems[0xb] = 0;
  maxrandom.m_backend.data._M_elems[0xc] = 0;
  maxrandom.m_backend.data._M_elems[0xd] = 0;
  maxrandom.m_backend.data._M_elems[0xe] = 0;
  maxrandom.m_backend.data._M_elems[0xf] = 0;
  maxrandom.m_backend.data._M_elems[0x10] = 0;
  maxrandom.m_backend.data._M_elems[0x11] = 0;
  maxrandom.m_backend.data._M_elems[0x12] = 0;
  maxrandom.m_backend.data._M_elems[0x13] = 0;
  maxrandom.m_backend.data._M_elems[0x14] = 0;
  maxrandom.m_backend.data._M_elems[0x15] = 0;
  maxrandom.m_backend.data._M_elems[0x16] = 0;
  maxrandom.m_backend.data._M_elems[0x17] = 0;
  maxrandom.m_backend.data._M_elems[0x18] = 0;
  maxrandom.m_backend.data._M_elems[0x19] = 0;
  maxrandom.m_backend.data._M_elems._104_5_ = 0;
  maxrandom.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  maxrandom.m_backend.exp = 0;
  maxrandom.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
            (&maxrandom.m_backend,&allow.m_backend,(double *)&result_1.m_backend);
  leavetol((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *)&result_1.m_backend,this);
  epsilon((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_b0,this);
  allow.m_backend.fpclass = cpp_dec_float_finite;
  allow.m_backend.prec_elem = 0x1c;
  allow.m_backend.data._M_elems[0] = 0;
  allow.m_backend.data._M_elems[1] = 0;
  allow.m_backend.data._M_elems[2] = 0;
  allow.m_backend.data._M_elems[3] = 0;
  allow.m_backend.data._M_elems[4] = 0;
  allow.m_backend.data._M_elems[5] = 0;
  allow.m_backend.data._M_elems[6] = 0;
  allow.m_backend.data._M_elems[7] = 0;
  allow.m_backend.data._M_elems[8] = 0;
  allow.m_backend.data._M_elems[9] = 0;
  allow.m_backend.data._M_elems[10] = 0;
  allow.m_backend.data._M_elems[0xb] = 0;
  allow.m_backend.data._M_elems[0xc] = 0;
  allow.m_backend.data._M_elems[0xd] = 0;
  allow.m_backend.data._M_elems[0xe] = 0;
  allow.m_backend.data._M_elems[0xf] = 0;
  allow.m_backend.data._M_elems[0x10] = 0;
  allow.m_backend.data._M_elems[0x11] = 0;
  allow.m_backend.data._M_elems[0x12] = 0;
  allow.m_backend.data._M_elems[0x13] = 0;
  allow.m_backend.data._M_elems[0x14] = 0;
  allow.m_backend.data._M_elems[0x15] = 0;
  allow.m_backend.data._M_elems[0x16] = 0;
  allow.m_backend.data._M_elems[0x17] = 0;
  allow.m_backend.data._M_elems[0x18] = 0;
  allow.m_backend.data._M_elems[0x19] = 0;
  allow.m_backend.data._M_elems._104_5_ = 0;
  allow.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  allow.m_backend.exp = 0;
  allow.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&allow.m_backend,&result_1.m_backend,&local_b0);
  uVar10 = (this->thecovectors->set).thenum;
  this_00 = &this->random;
LAB_003e1992:
  while (0 < (int)uVar10) {
    uVar10 = uVar10 - 1;
    result_1.m_backend.data._M_elems._0_8_ = coId(this,uVar10);
    bVar5 = isBasic(this,(SPxId *)&result_1.m_backend);
    result_1.m_backend.fpclass = cpp_dec_float_finite;
    result_1.m_backend.prec_elem = 0x1c;
    result_1.m_backend.data._M_elems[0] = 0;
    result_1.m_backend.data._M_elems[1] = 0;
    result_1.m_backend.data._M_elems[2] = 0;
    result_1.m_backend.data._M_elems[3] = 0;
    result_1.m_backend.data._M_elems[4] = 0;
    result_1.m_backend.data._M_elems[5] = 0;
    result_1.m_backend.data._M_elems[6] = 0;
    result_1.m_backend.data._M_elems[7] = 0;
    result_1.m_backend.data._M_elems[8] = 0;
    result_1.m_backend.data._M_elems[9] = 0;
    result_1.m_backend.data._M_elems[10] = 0;
    result_1.m_backend.data._M_elems[0xb] = 0;
    result_1.m_backend.data._M_elems[0xc] = 0;
    result_1.m_backend.data._M_elems[0xd] = 0;
    result_1.m_backend.data._M_elems[0xe] = 0;
    result_1.m_backend.data._M_elems[0xf] = 0;
    result_1.m_backend.data._M_elems[0x10] = 0;
    result_1.m_backend.data._M_elems[0x11] = 0;
    result_1.m_backend.data._M_elems[0x12] = 0;
    result_1.m_backend.data._M_elems[0x13] = 0;
    result_1.m_backend.data._M_elems[0x14] = 0;
    result_1.m_backend.data._M_elems[0x15] = 0;
    result_1.m_backend.data._M_elems[0x16] = 0;
    result_1.m_backend.data._M_elems[0x17] = 0;
    result_1.m_backend.data._M_elems[0x18] = 0;
    result_1.m_backend.data._M_elems[0x19] = 0;
    result_1.m_backend.data._M_elems._104_5_ = 0;
    result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_1.m_backend.exp = 0;
    result_1.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&result_1.m_backend,
               &(this->theCoUbound->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar10].m_backend,&allow.m_backend);
    tVar6 = boost::multiprecision::operator<=
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&result_1.m_backend,
                       (this->theCoPvec->
                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar10);
    if (!tVar6 || bVar5) goto LAB_003e1b3f;
    bVar5 = boost::multiprecision::operator!=
                      ((this->theCoUbound->val).
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar10,
                       (this->theCoLbound->val).
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar10);
    pcVar11 = &(this->theCoPvec->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar10].m_backend;
    if (!bVar5) {
      pcVar8 = pcVar11;
      pnVar9 = &local_130;
      for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pnVar9->m_backend).data._M_elems[0] = (pcVar8->data)._M_elems[0];
        pcVar8 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar8 + (ulong)bVar12 * -8 + 4);
        pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)pnVar9 + ((ulong)bVar12 * -2 + 1) * 4);
      }
      local_130.m_backend.exp = pcVar11->exp;
      local_130.m_backend.neg = pcVar11->neg;
      local_130.m_backend.fpclass = pcVar11->fpclass;
      local_130.m_backend.prec_elem = pcVar11->prec_elem;
      shiftUCbound(this,uVar10,&local_130);
      pnVar1 = (this->theCoUbound->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar2 = (this->theCoLbound->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      goto LAB_003e1d5a;
    }
    dVar3 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_double
                      (&minrandom.m_backend);
    dVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_double
                      (&maxrandom.m_backend);
    result_1.m_backend.data._M_elems._0_8_ = Random::next(this_00,dVar3,dVar4);
    local_4b8.fpclass = cpp_dec_float_finite;
    local_4b8.prec_elem = 0x1c;
    local_4b8.data._M_elems[0] = 0;
    local_4b8.data._M_elems[1] = 0;
    local_4b8.data._M_elems[2] = 0;
    local_4b8.data._M_elems[3] = 0;
    local_4b8.data._M_elems[4] = 0;
    local_4b8.data._M_elems[5] = 0;
    local_4b8.data._M_elems[6] = 0;
    local_4b8.data._M_elems[7] = 0;
    local_4b8.data._M_elems[8] = 0;
    local_4b8.data._M_elems[9] = 0;
    local_4b8.data._M_elems[10] = 0;
    local_4b8.data._M_elems[0xb] = 0;
    local_4b8.data._M_elems[0xc] = 0;
    local_4b8.data._M_elems[0xd] = 0;
    local_4b8.data._M_elems[0xe] = 0;
    local_4b8.data._M_elems[0xf] = 0;
    local_4b8.data._M_elems[0x10] = 0;
    local_4b8.data._M_elems[0x11] = 0;
    local_4b8.data._M_elems[0x12] = 0;
    local_4b8.data._M_elems[0x13] = 0;
    local_4b8.data._M_elems[0x14] = 0;
    local_4b8.data._M_elems[0x15] = 0;
    local_4b8.data._M_elems[0x16] = 0;
    local_4b8.data._M_elems[0x17] = 0;
    local_4b8.data._M_elems[0x18] = 0;
    local_4b8.data._M_elems[0x19] = 0;
    local_4b8.data._M_elems._104_5_ = 0;
    local_4b8.data._M_elems[0x1b]._1_3_ = 0;
    local_4b8.exp = 0;
    local_4b8.neg = false;
    boost::multiprecision::default_ops::
    eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
              (&local_4b8,pcVar11,(double *)&result_1.m_backend);
    shiftUCbound(this,uVar10,
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_4b8);
  }
  uVar10 = (this->thevectors->set).thenum;
LAB_003e1d7f:
  while( true ) {
    if ((int)uVar10 < 1) {
      return;
    }
    uVar10 = uVar10 - 1;
    result_1.m_backend.data._M_elems._0_8_ = id(this,uVar10);
    bVar5 = isBasic(this,(SPxId *)&result_1.m_backend);
    result_1.m_backend.fpclass = cpp_dec_float_finite;
    result_1.m_backend.prec_elem = 0x1c;
    result_1.m_backend.data._M_elems[0] = 0;
    result_1.m_backend.data._M_elems[1] = 0;
    result_1.m_backend.data._M_elems[2] = 0;
    result_1.m_backend.data._M_elems[3] = 0;
    result_1.m_backend.data._M_elems[4] = 0;
    result_1.m_backend.data._M_elems[5] = 0;
    result_1.m_backend.data._M_elems[6] = 0;
    result_1.m_backend.data._M_elems[7] = 0;
    result_1.m_backend.data._M_elems[8] = 0;
    result_1.m_backend.data._M_elems[9] = 0;
    result_1.m_backend.data._M_elems[10] = 0;
    result_1.m_backend.data._M_elems[0xb] = 0;
    result_1.m_backend.data._M_elems[0xc] = 0;
    result_1.m_backend.data._M_elems[0xd] = 0;
    result_1.m_backend.data._M_elems[0xe] = 0;
    result_1.m_backend.data._M_elems[0xf] = 0;
    result_1.m_backend.data._M_elems[0x10] = 0;
    result_1.m_backend.data._M_elems[0x11] = 0;
    result_1.m_backend.data._M_elems[0x12] = 0;
    result_1.m_backend.data._M_elems[0x13] = 0;
    result_1.m_backend.data._M_elems[0x14] = 0;
    result_1.m_backend.data._M_elems[0x15] = 0;
    result_1.m_backend.data._M_elems[0x16] = 0;
    result_1.m_backend.data._M_elems[0x17] = 0;
    result_1.m_backend.data._M_elems[0x18] = 0;
    result_1.m_backend.data._M_elems[0x19] = 0;
    result_1.m_backend.data._M_elems._104_5_ = 0;
    result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_1.m_backend.exp = 0;
    result_1.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&result_1.m_backend,
               &(this->theUbound->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar10].m_backend,&allow.m_backend);
    tVar6 = boost::multiprecision::operator<=
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&result_1.m_backend,
                       (this->thePvec->
                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar10);
    if (!tVar6 || bVar5) goto LAB_003e1f2c;
    bVar5 = boost::multiprecision::operator!=
                      ((this->theUbound->val).
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar10,
                       (this->theLbound->val).
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar10);
    pcVar11 = &(this->thePvec->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar10].m_backend;
    if (!bVar5) break;
    dVar3 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_double
                      (&minrandom.m_backend);
    dVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_double
                      (&maxrandom.m_backend);
    result_1.m_backend.data._M_elems._0_8_ = Random::next(this_00,dVar3,dVar4);
    local_5b8.fpclass = cpp_dec_float_finite;
    local_5b8.prec_elem = 0x1c;
    local_5b8.data._M_elems[0] = 0;
    local_5b8.data._M_elems[1] = 0;
    local_5b8.data._M_elems[2] = 0;
    local_5b8.data._M_elems[3] = 0;
    local_5b8.data._M_elems[4] = 0;
    local_5b8.data._M_elems[5] = 0;
    local_5b8.data._M_elems[6] = 0;
    local_5b8.data._M_elems[7] = 0;
    local_5b8.data._M_elems[8] = 0;
    local_5b8.data._M_elems[9] = 0;
    local_5b8.data._M_elems[10] = 0;
    local_5b8.data._M_elems[0xb] = 0;
    local_5b8.data._M_elems[0xc] = 0;
    local_5b8.data._M_elems[0xd] = 0;
    local_5b8.data._M_elems[0xe] = 0;
    local_5b8.data._M_elems[0xf] = 0;
    local_5b8.data._M_elems[0x10] = 0;
    local_5b8.data._M_elems[0x11] = 0;
    local_5b8.data._M_elems[0x12] = 0;
    local_5b8.data._M_elems[0x13] = 0;
    local_5b8.data._M_elems[0x14] = 0;
    local_5b8.data._M_elems[0x15] = 0;
    local_5b8.data._M_elems[0x16] = 0;
    local_5b8.data._M_elems[0x17] = 0;
    local_5b8.data._M_elems[0x18] = 0;
    local_5b8.data._M_elems[0x19] = 0;
    local_5b8.data._M_elems._104_5_ = 0;
    local_5b8.data._M_elems[0x1b]._1_3_ = 0;
    local_5b8.exp = 0;
    local_5b8.neg = false;
    boost::multiprecision::default_ops::
    eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
              (&local_5b8,pcVar11,(double *)&result_1.m_backend);
    shiftUPbound(this,uVar10,
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_5b8);
  }
  pcVar8 = pcVar11;
  pnVar9 = &local_230;
  for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
    (pnVar9->m_backend).data._M_elems[0] = (pcVar8->data)._M_elems[0];
    pcVar8 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar8 + (ulong)bVar12 * -8 + 4);
    pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar9 + ((ulong)bVar12 * -2 + 1) * 4);
  }
  local_230.m_backend.exp = pcVar11->exp;
  local_230.m_backend.neg = pcVar11->neg;
  local_230.m_backend.fpclass = pcVar11->fpclass;
  local_230.m_backend.prec_elem = pcVar11->prec_elem;
  shiftUPbound(this,uVar10,&local_230);
  pnVar1 = (this->theUbound->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar2 = (this->theLbound->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  goto LAB_003e2147;
LAB_003e1f2c:
  result_1.m_backend.fpclass = cpp_dec_float_finite;
  result_1.m_backend.prec_elem = 0x1c;
  result_1.m_backend.data._M_elems[0] = 0;
  result_1.m_backend.data._M_elems[1] = 0;
  result_1.m_backend.data._M_elems[2] = 0;
  result_1.m_backend.data._M_elems[3] = 0;
  result_1.m_backend.data._M_elems[4] = 0;
  result_1.m_backend.data._M_elems[5] = 0;
  result_1.m_backend.data._M_elems[6] = 0;
  result_1.m_backend.data._M_elems[7] = 0;
  result_1.m_backend.data._M_elems[8] = 0;
  result_1.m_backend.data._M_elems[9] = 0;
  result_1.m_backend.data._M_elems[10] = 0;
  result_1.m_backend.data._M_elems[0xb] = 0;
  result_1.m_backend.data._M_elems[0xc] = 0;
  result_1.m_backend.data._M_elems[0xd] = 0;
  result_1.m_backend.data._M_elems[0xe] = 0;
  result_1.m_backend.data._M_elems[0xf] = 0;
  result_1.m_backend.data._M_elems[0x10] = 0;
  result_1.m_backend.data._M_elems[0x11] = 0;
  result_1.m_backend.data._M_elems[0x12] = 0;
  result_1.m_backend.data._M_elems[0x13] = 0;
  result_1.m_backend.data._M_elems[0x14] = 0;
  result_1.m_backend.data._M_elems[0x15] = 0;
  result_1.m_backend.data._M_elems[0x16] = 0;
  result_1.m_backend.data._M_elems[0x17] = 0;
  result_1.m_backend.data._M_elems[0x18] = 0;
  result_1.m_backend.data._M_elems[0x19] = 0;
  result_1.m_backend.data._M_elems._104_5_ = 0;
  result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result_1.m_backend.exp = 0;
  result_1.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&result_1.m_backend,
             &(this->theLbound->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar10].m_backend,&allow.m_backend);
  tVar6 = boost::multiprecision::operator>=
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&result_1.m_backend,
                     (this->thePvec->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar10);
  if (tVar6 && !bVar5) {
    bVar5 = boost::multiprecision::operator!=
                      ((this->theUbound->val).
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar10,
                       (this->theLbound->val).
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar10);
    pcVar11 = &(this->thePvec->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar10].m_backend;
    if (bVar5) {
      dVar3 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_double
                        (&minrandom.m_backend);
      dVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_double
                        (&maxrandom.m_backend);
      result_1.m_backend.data._M_elems._0_8_ = Random::next(this_00,dVar3,dVar4);
      local_638.fpclass = cpp_dec_float_finite;
      local_638.prec_elem = 0x1c;
      local_638.data._M_elems[0] = 0;
      local_638.data._M_elems[1] = 0;
      local_638.data._M_elems[2] = 0;
      local_638.data._M_elems[3] = 0;
      local_638.data._M_elems[4] = 0;
      local_638.data._M_elems[5] = 0;
      local_638.data._M_elems[6] = 0;
      local_638.data._M_elems[7] = 0;
      local_638.data._M_elems[8] = 0;
      local_638.data._M_elems[9] = 0;
      local_638.data._M_elems[10] = 0;
      local_638.data._M_elems[0xb] = 0;
      local_638.data._M_elems[0xc] = 0;
      local_638.data._M_elems[0xd] = 0;
      local_638.data._M_elems[0xe] = 0;
      local_638.data._M_elems[0xf] = 0;
      local_638.data._M_elems[0x10] = 0;
      local_638.data._M_elems[0x11] = 0;
      local_638.data._M_elems[0x12] = 0;
      local_638.data._M_elems[0x13] = 0;
      local_638.data._M_elems[0x14] = 0;
      local_638.data._M_elems[0x15] = 0;
      local_638.data._M_elems[0x16] = 0;
      local_638.data._M_elems[0x17] = 0;
      local_638.data._M_elems[0x18] = 0;
      local_638.data._M_elems[0x19] = 0;
      local_638.data._M_elems._104_5_ = 0;
      local_638.data._M_elems[0x1b]._1_3_ = 0;
      local_638.exp = 0;
      local_638.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
                (&local_638,pcVar11,(double *)&result_1.m_backend);
      shiftLPbound(this,uVar10,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_638);
    }
    else {
      pcVar8 = pcVar11;
      pnVar9 = &local_2b0;
      for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pnVar9->m_backend).data._M_elems[0] = (pcVar8->data)._M_elems[0];
        pcVar8 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar8 + (ulong)bVar12 * -8 + 4);
        pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)pnVar9 + ((ulong)bVar12 * -2 + 1) * 4);
      }
      local_2b0.m_backend.exp = pcVar11->exp;
      local_2b0.m_backend.neg = pcVar11->neg;
      local_2b0.m_backend.fpclass = pcVar11->fpclass;
      local_2b0.m_backend.prec_elem = pcVar11->prec_elem;
      shiftLPbound(this,uVar10,&local_2b0);
      pnVar1 = (this->theLbound->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar2 = (this->theUbound->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
LAB_003e2147:
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                (&pnVar2[uVar10].m_backend,&pnVar1[uVar10].m_backend);
    }
  }
  goto LAB_003e1d7f;
LAB_003e1b3f:
  result_1.m_backend.fpclass = cpp_dec_float_finite;
  result_1.m_backend.prec_elem = 0x1c;
  result_1.m_backend.data._M_elems[0] = 0;
  result_1.m_backend.data._M_elems[1] = 0;
  result_1.m_backend.data._M_elems[2] = 0;
  result_1.m_backend.data._M_elems[3] = 0;
  result_1.m_backend.data._M_elems[4] = 0;
  result_1.m_backend.data._M_elems[5] = 0;
  result_1.m_backend.data._M_elems[6] = 0;
  result_1.m_backend.data._M_elems[7] = 0;
  result_1.m_backend.data._M_elems[8] = 0;
  result_1.m_backend.data._M_elems[9] = 0;
  result_1.m_backend.data._M_elems[10] = 0;
  result_1.m_backend.data._M_elems[0xb] = 0;
  result_1.m_backend.data._M_elems[0xc] = 0;
  result_1.m_backend.data._M_elems[0xd] = 0;
  result_1.m_backend.data._M_elems[0xe] = 0;
  result_1.m_backend.data._M_elems[0xf] = 0;
  result_1.m_backend.data._M_elems[0x10] = 0;
  result_1.m_backend.data._M_elems[0x11] = 0;
  result_1.m_backend.data._M_elems[0x12] = 0;
  result_1.m_backend.data._M_elems[0x13] = 0;
  result_1.m_backend.data._M_elems[0x14] = 0;
  result_1.m_backend.data._M_elems[0x15] = 0;
  result_1.m_backend.data._M_elems[0x16] = 0;
  result_1.m_backend.data._M_elems[0x17] = 0;
  result_1.m_backend.data._M_elems[0x18] = 0;
  result_1.m_backend.data._M_elems[0x19] = 0;
  result_1.m_backend.data._M_elems._104_5_ = 0;
  result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result_1.m_backend.exp = 0;
  result_1.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&result_1.m_backend,
             &(this->theCoLbound->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar10].m_backend,&allow.m_backend);
  tVar6 = boost::multiprecision::operator>=
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&result_1.m_backend,
                     (this->theCoPvec->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar10);
  if (tVar6 && !bVar5) {
    bVar5 = boost::multiprecision::operator!=
                      ((this->theCoUbound->val).
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar10,
                       (this->theCoLbound->val).
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar10);
    pcVar11 = &(this->theCoPvec->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar10].m_backend;
    if (bVar5) {
      dVar3 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_double
                        (&minrandom.m_backend);
      dVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_double
                        (&maxrandom.m_backend);
      result_1.m_backend.data._M_elems._0_8_ = Random::next(this_00,dVar3,dVar4);
      local_538.fpclass = cpp_dec_float_finite;
      local_538.prec_elem = 0x1c;
      local_538.data._M_elems[0] = 0;
      local_538.data._M_elems[1] = 0;
      local_538.data._M_elems[2] = 0;
      local_538.data._M_elems[3] = 0;
      local_538.data._M_elems[4] = 0;
      local_538.data._M_elems[5] = 0;
      local_538.data._M_elems[6] = 0;
      local_538.data._M_elems[7] = 0;
      local_538.data._M_elems[8] = 0;
      local_538.data._M_elems[9] = 0;
      local_538.data._M_elems[10] = 0;
      local_538.data._M_elems[0xb] = 0;
      local_538.data._M_elems[0xc] = 0;
      local_538.data._M_elems[0xd] = 0;
      local_538.data._M_elems[0xe] = 0;
      local_538.data._M_elems[0xf] = 0;
      local_538.data._M_elems[0x10] = 0;
      local_538.data._M_elems[0x11] = 0;
      local_538.data._M_elems[0x12] = 0;
      local_538.data._M_elems[0x13] = 0;
      local_538.data._M_elems[0x14] = 0;
      local_538.data._M_elems[0x15] = 0;
      local_538.data._M_elems[0x16] = 0;
      local_538.data._M_elems[0x17] = 0;
      local_538.data._M_elems[0x18] = 0;
      local_538.data._M_elems[0x19] = 0;
      local_538.data._M_elems._104_5_ = 0;
      local_538.data._M_elems[0x1b]._1_3_ = 0;
      local_538.exp = 0;
      local_538.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
                (&local_538,pcVar11,(double *)&result_1.m_backend);
      shiftLCbound(this,uVar10,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_538);
    }
    else {
      pcVar8 = pcVar11;
      pnVar9 = &local_1b0;
      for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pnVar9->m_backend).data._M_elems[0] = (pcVar8->data)._M_elems[0];
        pcVar8 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar8 + (ulong)bVar12 * -8 + 4);
        pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)pnVar9 + ((ulong)bVar12 * -2 + 1) * 4);
      }
      local_1b0.m_backend.exp = pcVar11->exp;
      local_1b0.m_backend.neg = pcVar11->neg;
      local_1b0.m_backend.fpclass = pcVar11->fpclass;
      local_1b0.m_backend.prec_elem = pcVar11->prec_elem;
      shiftLCbound(this,uVar10,&local_1b0);
      pnVar1 = (this->theCoLbound->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar2 = (this->theCoUbound->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
LAB_003e1d5a:
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                (&pnVar2[uVar10].m_backend,&pnVar1[uVar10].m_backend);
    }
  }
  goto LAB_003e1992;
}

Assistant:

void SPxSolverBase<R>::shiftPvec()
{

   /* the allowed tolerance is (rep() == ROW) ? tolerances()->floatingPointFeastol() : tolerances()->floatingPointOpttol() because thePvec is the primal VectorBase<R> in ROW and the
    * dual VectorBase<R> in COLUMN representation; this is equivalent to leavetol()
    */
   R minrandom = 10.0 * leavetol();
   R maxrandom = 100.0 * leavetol();
   R allow = leavetol() - epsilon();
   bool tmp;
   int i;

   assert(type() == LEAVE);
   assert(allow > 0.0);

   for(i = dim() - 1; i >= 0; --i)
   {
      tmp = !isBasic(coId(i));

      if((*theCoUbound)[i] + allow <= (*theCoPvec)[i] && tmp)
      {
         if((*theCoUbound)[i] != (*theCoLbound)[i])
            shiftUCbound(i, (*theCoPvec)[i] + random.next((double)minrandom, (double)maxrandom));
         else
         {
            shiftUCbound(i, (*theCoPvec)[i]);
            (*theCoLbound)[i] = (*theCoUbound)[i];
         }
      }
      else if((*theCoLbound)[i] - allow >= (*theCoPvec)[i] && tmp)
      {
         if((*theCoUbound)[i] != (*theCoLbound)[i])
            shiftLCbound(i, (*theCoPvec)[i] - random.next((double)minrandom, (double)maxrandom));
         else
         {
            shiftLCbound(i, (*theCoPvec)[i]);
            (*theCoUbound)[i] = (*theCoLbound)[i];
         }
      }
   }

   for(i = coDim() - 1; i >= 0; --i)
   {
      tmp = !isBasic(id(i));

      if((*theUbound)[i] + allow <= (*thePvec)[i] && tmp)
      {
         if((*theUbound)[i] != (*theLbound)[i])
            shiftUPbound(i, (*thePvec)[i] + random.next((double)minrandom, (double)maxrandom));
         else
         {
            shiftUPbound(i, (*thePvec)[i]);
            (*theLbound)[i] = (*theUbound)[i];
         }
      }
      else if((*theLbound)[i] - allow >= (*thePvec)[i] && tmp)
      {
         if((*theUbound)[i] != (*theLbound)[i])
            shiftLPbound(i, (*thePvec)[i] - random.next((double)minrandom, (double)maxrandom));
         else
         {
            shiftLPbound(i, (*thePvec)[i]);
            (*theUbound)[i] = (*theLbound)[i];
         }
      }
   }

#ifndef NDEBUG
   testBounds();
   SPxOut::debug(this, "DSHIFT02 shiftPvec: OK\n");
#endif
}